

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_rule.c
# Opt level: O0

void read_fare_rule(fare_rule_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  int local_2c;
  int i;
  char **field_values_local;
  char **field_names_local;
  int field_count_local;
  fare_rule_t *record_local;
  
  init_fare_rule(record);
  for (local_2c = 0; local_2c < field_count; local_2c = local_2c + 1) {
    iVar1 = strcmp(field_names[local_2c],"fare_id");
    if (iVar1 == 0) {
      strcpy(record->fare_id,field_values[local_2c]);
    }
    else {
      iVar1 = strcmp(field_names[local_2c],"route_id");
      if (iVar1 == 0) {
        strcpy(record->route_id,field_values[local_2c]);
      }
      else {
        iVar1 = strcmp(field_names[local_2c],"origin_id");
        if (iVar1 == 0) {
          strcpy(record->origin_id,field_values[local_2c]);
        }
        else {
          iVar1 = strcmp(field_names[local_2c],"destination_id");
          if (iVar1 == 0) {
            strcpy(record->destination_id,field_values[local_2c]);
          }
          else {
            iVar1 = strcmp(field_names[local_2c],"contains_id");
            if (iVar1 == 0) {
              strcpy(record->contains_id,field_values[local_2c]);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_fare_rule(fare_rule_t *record, int field_count, const char **field_names, const char **field_values) {
    init_fare_rule(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "fare_id") == 0) {
            strcpy(record->fare_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "route_id") == 0) {
            strcpy(record->route_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "origin_id") == 0) {
            strcpy(record->origin_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "destination_id") == 0) {
            strcpy(record->destination_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "contains_id") == 0) {
            strcpy(record->contains_id, field_values[i]);
            continue;
        }
    }
}